

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_zstd.c
# Opt level: O3

int string_to_number(char *string,intmax_t *numberp)

{
  intmax_t iVar1;
  int *piVar2;
  char *end;
  char *local_20;
  
  if ((string != (char *)0x0) && (*string != '\0')) {
    iVar1 = strtoimax(string,&local_20,10);
    *numberp = iVar1;
    if ((local_20 != string) &&
       ((*local_20 == '\0' && (piVar2 = __errno_location(), *piVar2 != 0x4b)))) {
      return 0;
    }
    *numberp = 0;
  }
  return -0x14;
}

Assistant:

static int
string_to_number(const char *string, intmax_t *numberp)
{
	char *end;

	if (string == NULL || *string == '\0')
		return (ARCHIVE_WARN);
	*numberp = strtoimax(string, &end, 10);
	if (end == string || *end != '\0' || errno == EOVERFLOW) {
		*numberp = 0;
		return (ARCHIVE_WARN);
	}
	return (ARCHIVE_OK);
}